

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

void __thiscall
lzham::quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
          (quasi_adaptive_huffman_data_model *this,lzham_malloc_context malloc_context,bool encoding
          ,uint total_syms,uint max_update_interval,uint adapt_rate)

{
  int in_ECX;
  undefined1 in_DL;
  lzham_malloc_context in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  uint16 *unaff_retaddr;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar1;
  
  uVar1 = CONCAT13(in_DL,in_stack_ffffffffffffffec) & 0x1ffffff;
  *in_RDI = in_RSI;
  vector<unsigned_short>::vector((vector<unsigned_short> *)(in_RDI + 1),in_RSI);
  vector<unsigned_short>::vector((vector<unsigned_short> *)(in_RDI + 4),in_RSI);
  vector<unsigned_short>::vector((vector<unsigned_short> *)(in_RDI + 7),in_RSI);
  vector<unsigned_char>::vector((vector<unsigned_char> *)(in_RDI + 10),in_RSI);
  in_RDI[0xd] = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  *(undefined4 *)((long)in_RDI + 0x74) = 0;
  *(undefined4 *)(in_RDI + 0xf) = 0;
  *(undefined4 *)((long)in_RDI + 0x7c) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined1 *)((long)in_RDI + 0x84) = 0;
  *(short *)((long)in_RDI + 0x86) = (short)in_R8D;
  *(short *)(in_RDI + 0x11) = (short)in_R9D;
  *(byte *)((long)in_RDI + 0x8a) = (byte)(uVar1 >> 0x18) & 1;
  if (in_ECX != 0) {
    init2((quasi_adaptive_huffman_data_model *)CONCAT44(uVar1,in_ECX),
          (lzham_malloc_context)CONCAT44(in_R8D,in_R9D),(bool)in_stack_ffffffffffffffdf,
          in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
          unaff_retaddr);
  }
  return;
}

Assistant:

quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model(lzham_malloc_context malloc_context, bool encoding, uint total_syms, uint max_update_interval, uint adapt_rate) :
      m_malloc_context(malloc_context),
      m_initial_sym_freq(malloc_context),
      m_sym_freq(malloc_context),
      m_codes(malloc_context),
      m_code_sizes(malloc_context),
      m_pDecode_tables(NULL),
      m_total_syms(0),
      m_max_cycle(0),
      m_update_cycle(0),
      m_symbols_until_update(0),
      m_total_count(0),
      m_decoder_table_bits(0),
      m_max_update_interval(static_cast<uint16>(max_update_interval)),
      m_adapt_rate(static_cast<uint16>(adapt_rate)),
      m_encoding(encoding)
   {
      if (total_syms)
      {
         init2(malloc_context, encoding, total_syms, max_update_interval, adapt_rate, NULL);
      }
   }